

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Morse.cpp
# Opt level: O2

void __thiscall OpenMD::Morse::initialize(Morse *this)

{
  pointer piVar1;
  ForceField *pFVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  AtomType *this_00;
  AtomType *this_01;
  long lVar6;
  NonBondedInteractionType *this_02;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *this_03;
  KeyType keys;
  MapTypeIterator local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *local_78;
  string local_70;
  string local_50;
  
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->Mtypes)._M_t);
  piVar1 = (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->Mtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  std::
  vector<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>,_std::allocator<std::vector<OpenMD::MorseInteractionData,_std::allocator<OpenMD::MorseInteractionData>_>_>_>
  ::clear(&this->MixingMap);
  this->nM_ = 0;
  local_70._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->Mtids,
             (this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
             _M_node_count,(value_type_conflict2 *)&local_70);
  pFVar2 = this->forceField_;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0._M_node =
       (pFVar2->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  if ((_Rb_tree_header *)local_a0._M_node ==
      &(pFVar2->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header) {
    this_02 = (NonBondedInteractionType *)0x0;
  }
  else {
    this_02 = *(NonBondedInteractionType **)(local_a0._M_node + 2);
  }
  this_03 = &pFVar2->nonBondedInteractionTypeCont_;
  local_78 = this_03;
  while (this_02 != (NonBondedInteractionType *)0x0) {
    bVar5 = NonBondedInteractionType::isMorse(this_02);
    if (bVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_a0._M_node + 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_98,&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_70);
      this_00 = ForceField::getAtomType
                          (this->forceField_,
                           local_98.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      if (this_00 == (AtomType *)0x0) {
        pcVar3 = ((local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        snprintf(painCave.errMsg,2000,
                 "Morse::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n"
                 ,pcVar3,pcVar3,
                 local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      this_01 = ForceField::getAtomType
                          (this->forceField_,
                           local_98.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
      if (this_01 == (AtomType *)0x0) {
        pcVar3 = local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        snprintf(painCave.errMsg,2000,
                 "Morse::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,pcVar3,((local_98.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,pcVar3);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      lVar6 = __dynamic_cast(this_02,&NonBondedInteractionType::typeinfo,
                             &MorseInteractionType::typeinfo,0);
      if (lVar6 == 0) {
        AtomType::getName_abi_cxx11_(&local_70,this_00);
        uVar4 = CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_);
        AtomType::getName_abi_cxx11_(&local_50,this_01);
        snprintf(painCave.errMsg,2000,
                 "Morse::initialize could not convert NonBondedInteractionType\n\tto MorseInteractionType for %s - %s interaction.\n"
                 ,uVar4,local_50._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      addExplicitInteraction
                (this,this_00,this_01,*(RealType *)(lVar6 + 0x60),*(RealType *)(lVar6 + 0x70),
                 *(RealType *)(lVar6 + 0x68),*(MorseType *)(lVar6 + 0x78));
      this_03 = local_78;
    }
    this_02 = TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType(this_03,&local_a0);
  }
  this->initialized_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void Morse::initialize() {
    Mtypes.clear();
    Mtids.clear();
    MixingMap.clear();
    nM_ = 0;

    Mtids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isMorse()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Morse::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Morse::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        MorseInteractionType* mit = dynamic_cast<MorseInteractionType*>(nbt);

        if (mit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "Morse::initialize could not convert NonBondedInteractionType\n"
              "\tto MorseInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType De   = mit->getD();
        RealType Re   = mit->getR();
        RealType beta = mit->getBeta();

        MorseType variant = mit->getInteractionType();
        addExplicitInteraction(at1, at2, De, Re, beta, variant);
      }
    }
    initialized_ = true;
  }